

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResultCollector.cpp
# Opt level: O2

void __thiscall tcu::ResultCollector::ResultCollector(ResultCollector *this)

{
  allocator<char> local_12;
  allocator<char> local_11;
  
  this->m_log = (TestLog *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_prefix,
             deqp::gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1,&local_11);
  this->m_result = QP_TEST_RESULT_LAST;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_message,"Pass",&local_12);
  return;
}

Assistant:

ResultCollector::ResultCollector (void)
	: m_log		(DE_NULL)
	, m_prefix	("")
	, m_result	(QP_TEST_RESULT_LAST)
	, m_message ("Pass")
{
}